

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_derived_*const_&,_const_base_*const_&> * __thiscall
Catch::ExprLhs<C_A_T_C_H_T_E_S_T_0()::derived_const*const&>::operator==
          (BinaryExpr<const_derived_*const_&,_const_base_*const_&> *__return_storage_ptr__,
          ExprLhs<C_A_T_C_H_T_E_S_T_0()::derived_const*const&> *this,base **rhs)

{
  derived **ppdVar1;
  base *pbVar2;
  base *pbVar3;
  StringRef local_40;
  
  ppdVar1 = *(derived ***)this;
  pbVar2 = &(*ppdVar1)->super_base;
  pbVar3 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = pbVar2 == pbVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021da10;
  __return_storage_ptr__->m_lhs = ppdVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }